

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

IDiagObjectAddress * __thiscall
Js::SlotArrayVariablesWalker::GetObjectAddress(SlotArrayVariablesWalker *this,int index)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  LocalObjectAddressForSlot *this_00;
  Type *ppDVar5;
  IDiagObjectModelWalkerBase local_40;
  ScopeSlots slotArray;
  
  if ((((this->super_VariableWalkerBase).pMembersList)->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).count <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x29e,"(index < pMembersList->Count())",
                                "index < pMembersList->Count()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  GetSlotArray((SlotArrayVariablesWalker *)&local_40);
  iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
  this_00 = (LocalObjectAddressForSlot *)
            new<Memory::ArenaAllocator>
                      (0x20,(ArenaAllocator *)CONCAT44(extraout_var,iVar3),0x364470);
  Memory::Recycler::WBSetBit((char *)&slotArray);
  slotArray.slotArray.ptr = (Type)(Type)local_40._vptr_IDiagObjectModelWalkerBase;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&slotArray);
  ppDVar5 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((this->super_VariableWalkerBase).pMembersList,index);
  LocalObjectAddressForSlot::LocalObjectAddressForSlot(this_00,&slotArray,index,(*ppDVar5)->aVar);
  return &this_00->super_IDiagObjectAddress;
}

Assistant:

IDiagObjectAddress * SlotArrayVariablesWalker::GetObjectAddress(int index)
    {
        Assert(index < pMembersList->Count());
        ScopeSlots slotArray = GetSlotArray();
        return Anew(pFrame->GetArena(), LocalObjectAddressForSlot, slotArray, index, pMembersList->Item(index)->aVar);
    }